

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::(anonymous_namespace)::GeneratedMessageReflectionSwapTest_OneofBothSet_Test::
~GeneratedMessageReflectionSwapTest_OneofBothSet_Test
          (GeneratedMessageReflectionSwapTest_OneofBothSet_Test *this)

{
  protobuf::anon_unknown_0::GeneratedMessageReflectionSwapTest_OneofBothSet_Test::
  ~GeneratedMessageReflectionSwapTest_OneofBothSet_Test
            ((GeneratedMessageReflectionSwapTest_OneofBothSet_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(GeneratedMessageReflectionSwapTest, OneofBothSet) {
  unittest::TestOneof2 lhs, rhs;
  TestUtil::SetOneof1(&lhs);
  TestUtil::SetOneof2(&rhs);

  Swap(lhs.GetReflection(), &lhs, &rhs);

  TestUtil::ExpectOneofSet2(lhs);
  TestUtil::ExpectOneofSet1(rhs);
}